

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamRandomAccessController_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::BamRandomAccessController::CreateIndex
          (BamRandomAccessController *this,BamReaderPrivate *reader,IndexType *type)

{
  bool bVar1;
  uint uVar2;
  ostream *this_00;
  int *in_RDX;
  string message;
  string indexError;
  stringstream s;
  BamIndex *newIndex;
  BamIndex *in_stack_fffffffffffffd08;
  allocator *paVar3;
  BamRandomAccessController *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  BamReaderPrivate *in_stack_fffffffffffffd20;
  IndexType *in_stack_fffffffffffffd28;
  allocator local_2b9;
  string local_2b8 [24];
  string *in_stack_fffffffffffffd60;
  string *in_stack_fffffffffffffd68;
  BamRandomAccessController *in_stack_fffffffffffffd70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258 [39];
  allocator local_231;
  string local_230 [32];
  stringstream local_210 [16];
  ostream local_200 [376];
  BamIndex *local_88;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  int *local_20;
  byte local_1;
  
  local_20 = in_RDX;
  bVar1 = BamReaderPrivate::IsOpen((BamReaderPrivate *)0x2cb309);
  if (bVar1) {
    local_88 = BamIndexFactory::CreateIndexOfType
                         (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
    if (local_88 == (BamIndex *)0x0) {
      std::__cxx11::stringstream::stringstream(local_210);
      this_00 = std::operator<<(local_200,"could not create index of type: ");
      std::ostream::operator<<(this_00,*local_20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_230,"BamRandomAccessController::CreateIndex",&local_231);
      std::__cxx11::stringstream::str();
      SetErrorString(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      std::__cxx11::string::~string(local_258);
      std::__cxx11::string::~string(local_230);
      std::allocator<char>::~allocator((allocator<char> *)&local_231);
      local_1 = 0;
      std::__cxx11::stringstream::~stringstream(local_210);
    }
    else {
      uVar2 = (*local_88->_vptr_BamIndex[2])();
      if ((uVar2 & 1) == 0) {
        __rhs = &local_278;
        BamIndex::GetErrorString_abi_cxx11_(in_stack_fffffffffffffd08);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffffd68,"could not create index: \n\t",__rhs);
        paVar3 = &local_2b9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2b8,"BamRandomAccessController::CreateIndex",paVar3);
        SetErrorString(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60
                      );
        std::__cxx11::string::~string(local_2b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
        local_1 = 0;
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffd68);
        std::__cxx11::string::~string((string *)&local_278);
      }
      else {
        SetIndex(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
        local_1 = 1;
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"BamRandomAccessController::CreateIndex",&local_41);
    paVar3 = &local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"cannot create index for unopened reader",paVar3);
    SetErrorString(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool BamRandomAccessController::CreateIndex(BamReaderPrivate* reader,
                                            const BamIndex::IndexType& type)
{
    // skip if reader is invalid
    assert(reader);
    if (!reader->IsOpen()) {
        SetErrorString("BamRandomAccessController::CreateIndex",
                       "cannot create index for unopened reader");
        return false;
    }

    // create new index of requested type
    BamIndex* newIndex = BamIndexFactory::CreateIndexOfType(type, reader);
    if (newIndex == 0) {
        std::stringstream s;
        s << "could not create index of type: " << type;
        SetErrorString("BamRandomAccessController::CreateIndex", s.str());
        return false;
    }

    // attempt to build index from current BamReader file
    if (!newIndex->Create()) {
        const std::string indexError = newIndex->GetErrorString();
        const std::string message = "could not create index: \n\t" + indexError;
        SetErrorString("BamRandomAccessController::CreateIndex", message);
        return false;
    }

    // save new index & return success
    SetIndex(newIndex);
    return true;
}